

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::scrollToBottom(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *pQVar1;
  QScrollBar *this_00;
  QAbstractSlider *in_RDI;
  QAbstractItemViewPrivate *d;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffe0;
  int value;
  QAbstractSlider *this_01;
  
  this_01 = in_RDI;
  pQVar1 = d_func((QAbstractItemView *)0x80d3dc);
  if ((pQVar1->delayedPendingLayout & 1U) != 0) {
    QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffffe0);
    (**(code **)(*(long *)&in_RDI->super_QWidget + 0x268))();
  }
  value = (int)((ulong)pQVar1 >> 0x20);
  this_00 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffffe0)
  ;
  QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
  QAbstractSlider::maximum(&this_00->super_QAbstractSlider);
  QAbstractSlider::setValue(this_01,value);
  return;
}

Assistant:

void QAbstractItemView::scrollToBottom()
{
    Q_D(QAbstractItemView);
    if (d->delayedPendingLayout) {
        d->executePostedLayout();
        updateGeometries();
    }
    verticalScrollBar()->setValue(verticalScrollBar()->maximum());
}